

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerNewScObjectLiteral(Lowerer *this,Instr *newObjInstr)

{
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  PropertyIndex PVar4;
  uint32 uVar5;
  uint uVar6;
  Opnd *pOVar7;
  IntConstOpnd *pIVar8;
  JITTimeFunctionBody *pJVar9;
  undefined8 *address;
  PropertyIdArray *propIds_00;
  intptr_t address_00;
  AddrOpnd *opndArg;
  AddrOpnd *opndArg_00;
  MemRefOpnd *src;
  RegOpnd *baseOpnd;
  IndirOpnd *testSrc1;
  DynamicTypeHandler *pDVar10;
  HelperCallOpnd *src1Opnd;
  Instr *instr;
  undefined4 *puVar11;
  DynamicType *local_c0;
  Instr *ensureTypeInstr;
  HelperCallOpnd *opndHelper;
  DynamicType *literalType;
  RegOpnd *dstOpnd;
  uint slotCapacity;
  uint inlineSlotCapacity;
  intptr_t propArrayAddr;
  PropertyIdArray *propIds;
  IntConstOpnd *propertyArrayIdOpnd;
  Opnd *propertyArrayOpnd;
  Opnd *literalTypeOpnd;
  Opnd *literalTypeRefOpnd;
  LabelInstr *allocLabel;
  LabelInstr *helperLabel;
  intptr_t literalTypeRef;
  IntConstOpnd *literalObjectIdOpnd;
  Func *func;
  Instr *newObjInstr_local;
  Lowerer *this_local;
  
  this_00 = this->m_func;
  pOVar7 = IR::Instr::UnlinkSrc2(newObjInstr);
  pIVar8 = IR::Opnd::AsIntConstOpnd(pOVar7);
  pJVar9 = Func::GetJITFunctionBody(newObjInstr->m_func);
  uVar5 = IR::IntConstOpnd::AsUint32(pIVar8);
  address = (undefined8 *)JITTimeFunctionBody::GetObjectLiteralTypeRef(pJVar9,uVar5);
  allocLabel = (LabelInstr *)0x0;
  literalTypeRefOpnd = (Opnd *)0x0;
  pOVar7 = IR::Instr::UnlinkSrc1(newObjInstr);
  pIVar8 = IR::Opnd::AsIntConstOpnd(pOVar7);
  pJVar9 = Func::GetJITFunctionBody(newObjInstr->m_func);
  uVar5 = IR::IntConstOpnd::AsUint32(pIVar8);
  propIds_00 = JITTimeFunctionBody::ReadPropertyIdArrayFromAuxData(pJVar9,uVar5);
  pJVar9 = Func::GetJITFunctionBody(newObjInstr->m_func);
  uVar5 = IR::IntConstOpnd::AsUint32(pIVar8);
  address_00 = JITTimeFunctionBody::GetAuxDataAddr(pJVar9,uVar5);
  dstOpnd._4_4_ = Js::JavascriptOperators::GetLiteralInlineSlotCapacity(propIds_00);
  dstOpnd._0_4_ = Js::JavascriptOperators::GetLiteralSlotCapacity(propIds_00);
  opndArg = IR::AddrOpnd::New((intptr_t)address,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0)
  ;
  opndArg_00 = IR::AddrOpnd::New(address_00,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
  bVar2 = Func::IsOOPJIT(this_00);
  if ((bVar2) || ((DAT_01eafdde & 1) == 0)) {
    local_c0 = (DynamicType *)0x0;
  }
  else {
    local_c0 = (DynamicType *)*address;
  }
  if ((local_c0 == (DynamicType *)0x0) || (bVar2 = Js::DynamicType::GetIsShared(local_c0), !bVar2))
  {
    allocLabel = IR::LabelInstr::New(Label,this_00,true);
    literalTypeRefOpnd = (Opnd *)IR::LabelInstr::New(Label,this_00,false);
    propertyArrayOpnd = &IR::RegOpnd::New(TyUint64,this_00)->super_Opnd;
    src = IR::MemRefOpnd::New((intptr_t)address,TyUint64,this_00,AddrOpndKindDynamicMisc);
    InsertMove(propertyArrayOpnd,&src->super_Opnd,newObjInstr,true);
    InsertTestBranch(propertyArrayOpnd,propertyArrayOpnd,BrEq_A,allocLabel,newObjInstr);
    baseOpnd = IR::Opnd::AsRegOpnd(propertyArrayOpnd);
    uVar5 = Js::DynamicType::GetOffsetOfIsShared();
    testSrc1 = IR::IndirOpnd::New(baseOpnd,uVar5,TyInt8,this_00,false);
    pIVar8 = IR::IntConstOpnd::New(1,TyInt8,this_00,true);
    InsertTestBranch(&testSrc1->super_Opnd,&pIVar8->super_Opnd,BrEq_A,allocLabel,newObjInstr);
    pOVar7 = IR::Instr::GetDst(newObjInstr);
    literalType = (DynamicType *)IR::Opnd::AsRegOpnd(pOVar7);
  }
  else {
    propertyArrayOpnd =
         &IR::AddrOpnd::New(local_c0,AddrOpndKindDynamicType,this_00,false,(Var)0x0)->super_Opnd;
    pOVar7 = IR::Instr::UnlinkDst(newObjInstr);
    literalType = (DynamicType *)IR::Opnd::AsRegOpnd(pOVar7);
    pDVar10 = Js::DynamicType::GetTypeHandler(local_c0);
    uVar3 = Js::DynamicTypeHandler::GetInlineSlotCapacity(pDVar10);
    if (dstOpnd._4_4_ != uVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xde3,
                         "(inlineSlotCapacity == literalType->GetTypeHandler()->GetInlineSlotCapacity())"
                         ,
                         "inlineSlotCapacity == literalType->GetTypeHandler()->GetInlineSlotCapacity()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    pDVar10 = Js::DynamicType::GetTypeHandler(local_c0);
    uVar6 = Js::DynamicTypeHandler::GetSlotCapacity(pDVar10);
    if ((uint)dstOpnd != uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xde4,
                         "(slotCapacity == (uint)literalType->GetTypeHandler()->GetSlotCapacity())",
                         "slotCapacity == (uint)literalType->GetTypeHandler()->GetSlotCapacity()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
  }
  if (allocLabel == (LabelInstr *)0x0) {
    if (literalTypeRefOpnd != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xdfb,"(allocLabel == nullptr)","allocLabel == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
  }
  else {
    InsertBranch(Br,(LabelInstr *)literalTypeRefOpnd,newObjInstr);
    IR::Instr::InsertBefore(newObjInstr,&allocLabel->super_Instr);
    src1Opnd = IR::HelperCallOpnd::New(HelperEnsureObjectLiteralType,this_00);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,newObjInstr,&opndArg->super_Opnd);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,newObjInstr,&opndArg_00->super_Opnd);
    LoadScriptContext(this,newObjInstr);
    instr = IR::Instr::New(Call,propertyArrayOpnd,&src1Opnd->super_Opnd,this_00);
    IR::Instr::InsertBefore(newObjInstr,instr);
    LowererMD::LowerCall(&this->m_lowererMD,instr,0);
    IR::Instr::InsertBefore(newObjInstr,(Instr *)literalTypeRefOpnd);
  }
  bVar2 = Js::FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds_00);
  if (bVar2) {
    PVar4 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    if (dstOpnd._4_4_ < PVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xe03,
                         "(inlineSlotCapacity >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity())"
                         ,
                         "inlineSlotCapacity >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if (dstOpnd._4_4_ != (uint)dstOpnd) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xe04,"(inlineSlotCapacity == slotCapacity)",
                         "inlineSlotCapacity == slotCapacity");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    PVar4 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    dstOpnd._0_4_ = dstOpnd._4_4_ - PVar4;
    dstOpnd._4_4_ = (uint)dstOpnd;
  }
  GenerateDynamicObjectAlloc
            (this,newObjInstr,dstOpnd._4_4_,(uint)dstOpnd,(RegOpnd *)literalType,propertyArrayOpnd);
  IR::Instr::Remove(newObjInstr);
  return;
}

Assistant:

void
Lowerer::LowerNewScObjectLiteral(IR::Instr *newObjInstr)
{
    Func * func = m_func;
    IR::IntConstOpnd * literalObjectIdOpnd = newObjInstr->UnlinkSrc2()->AsIntConstOpnd();
    intptr_t literalTypeRef = newObjInstr->m_func->GetJITFunctionBody()->GetObjectLiteralTypeRef(literalObjectIdOpnd->AsUint32());

    IR::LabelInstr * helperLabel = nullptr;
    IR::LabelInstr * allocLabel = nullptr;
    IR::Opnd * literalTypeRefOpnd;
    IR::Opnd * literalTypeOpnd;
    IR::Opnd * propertyArrayOpnd;

    IR::IntConstOpnd * propertyArrayIdOpnd = newObjInstr->UnlinkSrc1()->AsIntConstOpnd();
    const Js::PropertyIdArray * propIds = newObjInstr->m_func->GetJITFunctionBody()->ReadPropertyIdArrayFromAuxData(propertyArrayIdOpnd->AsUint32());
    intptr_t propArrayAddr = newObjInstr->m_func->GetJITFunctionBody()->GetAuxDataAddr(propertyArrayIdOpnd->AsUint32());
    uint inlineSlotCapacity = Js::JavascriptOperators::GetLiteralInlineSlotCapacity(propIds);
    uint slotCapacity = Js::JavascriptOperators::GetLiteralSlotCapacity(propIds);
    IR::RegOpnd * dstOpnd;

    literalTypeRefOpnd = IR::AddrOpnd::New(literalTypeRef, IR::AddrOpndKindDynamicMisc, this->m_func);
    propertyArrayOpnd = IR::AddrOpnd::New(propArrayAddr, IR::AddrOpndKindDynamicMisc, this->m_func);

    //#if 0 TODO: OOP JIT, obj literal types
    // should pass in isShared bit through RPC, enable for in-proc jit to see perf impact
    Js::DynamicType * literalType = func->IsOOPJIT() || !CONFIG_FLAG(OOPJITMissingOpts) ? nullptr : *(Js::DynamicType **)literalTypeRef;

    if (literalType == nullptr || !literalType->GetIsShared())
    {
        helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        allocLabel = IR::LabelInstr::New(Js::OpCode::Label, func);

        literalTypeOpnd = IR::RegOpnd::New(TyMachPtr, func);
        InsertMove(literalTypeOpnd, IR::MemRefOpnd::New(literalTypeRef, TyMachPtr, func), newObjInstr);
        InsertTestBranch(literalTypeOpnd, literalTypeOpnd,
            Js::OpCode::BrEq_A, helperLabel, newObjInstr);
        InsertTestBranch(IR::IndirOpnd::New(literalTypeOpnd->AsRegOpnd(), Js::DynamicType::GetOffsetOfIsShared(), TyInt8, func),
            IR::IntConstOpnd::New(1, TyInt8, func, true), Js::OpCode::BrEq_A, helperLabel, newObjInstr);

        dstOpnd = newObjInstr->GetDst()->AsRegOpnd();
    }
    else
    {
        literalTypeOpnd = IR::AddrOpnd::New(literalType, IR::AddrOpndKindDynamicType, func);
        dstOpnd = newObjInstr->UnlinkDst()->AsRegOpnd();
        Assert(inlineSlotCapacity == literalType->GetTypeHandler()->GetInlineSlotCapacity());
        Assert(slotCapacity == (uint)literalType->GetTypeHandler()->GetSlotCapacity());
    }

    if (helperLabel)
    {
        InsertBranch(Js::OpCode::Br, allocLabel, newObjInstr);

        // Slow path to ensure the type is there
        newObjInstr->InsertBefore(helperLabel);
        IR::HelperCallOpnd * opndHelper = IR::HelperCallOpnd::New(IR::HelperEnsureObjectLiteralType, func);

        m_lowererMD.LoadHelperArgument(newObjInstr, literalTypeRefOpnd);
        m_lowererMD.LoadHelperArgument(newObjInstr, propertyArrayOpnd);
        LoadScriptContext(newObjInstr);

        IR::Instr * ensureTypeInstr = IR::Instr::New(Js::OpCode::Call, literalTypeOpnd, opndHelper, func);
        newObjInstr->InsertBefore(ensureTypeInstr);
        m_lowererMD.LowerCall(ensureTypeInstr, 0);

        newObjInstr->InsertBefore(allocLabel);
    }
    else
    {
        Assert(allocLabel == nullptr);
    }

    // For the next call:
    //     inlineSlotCapacity == Number of slots to allocate beyond the DynamicObject header
    //     slotCapacity - inlineSlotCapacity == Number of aux slots to allocate
    if(Js::FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds))
    {
        Assert(inlineSlotCapacity >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity());
        Assert(inlineSlotCapacity == slotCapacity);
        slotCapacity = inlineSlotCapacity -= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    }
    GenerateDynamicObjectAlloc(
        newObjInstr,
        inlineSlotCapacity,
        slotCapacity,
        dstOpnd,
        literalTypeOpnd);

    newObjInstr->Remove();
}